

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2014.h
# Opt level: O0

void __thiscall CTB<RemSP>::PerformLabeling(CTB<RemSP> *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uchar *puVar8;
  uint *puVar9;
  uint *puStack_f0;
  int c_i;
  uint *img_labels_row_1;
  uint *img_labels_row_end;
  uint *img_labels_row_start;
  int r_i;
  int c;
  int prev_state;
  int prob_fol_state;
  uint *img_labels_row_fol;
  uint *img_labels_row_prev;
  uint *img_labels_row;
  uchar *img_row_fol;
  uchar *img_row_prev;
  uchar *img_row;
  int r;
  int h;
  int w;
  int local_7c;
  Size local_78;
  Mat_<int> local_70;
  CTB<RemSP> *local_10;
  CTB<RemSP> *this_local;
  
  local_10 = this;
  cv::MatSize::operator()((MatSize *)&local_78);
  local_7c = 0;
  cv::Mat_<int>::Mat_(&local_70,&local_78,&local_7c);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_70)
  ;
  cv::Mat_<int>::~Mat_(&local_70);
  RemSP::Alloc(((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1)
               / 2) * ((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                 field_0xc + 1) / 2) + 1);
  RemSP::Setup();
  iVar1 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  iVar2 = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  for (img_row._0_4_ = 0; (int)img_row < iVar2; img_row._0_4_ = (int)img_row + 2) {
    puVar8 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row);
    lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    lVar4 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar9 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_row);
    lVar5 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    lVar6 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    c = -1;
    r_i = -1;
    for (img_labels_row_start._4_4_ = 0; img_labels_row_start._4_4_ < iVar1;
        img_labels_row_start._4_4_ = img_labels_row_start._4_4_ + 1) {
      switch(r_i) {
      case 1:
        if (puVar8[img_labels_row_start._4_4_] == '\0') {
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            uVar7 = RemSP::NewLabel();
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) = uVar7;
            r_i = 3;
          }
        }
        else {
          r_i = 2;
          if (((int)img_row + -1 < 0) || (puVar8[img_labels_row_start._4_4_ - lVar3] == '\0')) {
            if (((int)img_row + -1 < 0) ||
               ((iVar1 <= img_labels_row_start._4_4_ + 1 ||
                (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')))) {
              c = 6;
              if ((img_labels_row_start._4_4_ + -1 < 0) ||
                 (((int)img_row + -1 < 0 ||
                  (puVar8[(img_labels_row_start._4_4_ + -1) - lVar3] == '\0')))) {
                uVar7 = RemSP::NewLabel();
                puVar9[img_labels_row_start._4_4_] = uVar7;
              }
              else {
                puVar9[img_labels_row_start._4_4_] =
                     *(uint *)((long)puVar9 + ((long)(img_labels_row_start._4_4_ + -1) * 4 - lVar5))
                ;
              }
            }
            else {
              puVar9[img_labels_row_start._4_4_] =
                   *(uint *)((long)puVar9 + ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5));
              c = 5;
              if (((-1 < img_labels_row_start._4_4_ + -1) && (-1 < (int)img_row + -1)) &&
                 (puVar8[(img_labels_row_start._4_4_ + -1) - lVar3] != '\0')) {
                RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                             *(uint *)((long)puVar9 +
                                      ((long)(img_labels_row_start._4_4_ + -1) * 4 - lVar5)));
              }
            }
          }
          else {
            puVar9[img_labels_row_start._4_4_] =
                 *(uint *)((long)puVar9 + ((long)img_labels_row_start._4_4_ * 4 - lVar5));
            c = 4;
          }
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_];
          }
        }
        break;
      case 2:
        if (puVar8[img_labels_row_start._4_4_] == '\0') {
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_ + -1];
            r_i = 7;
          }
          else {
            r_i = 1;
          }
        }
        else {
          if (c == 4) {
            r_i = 4;
            puVar9[img_labels_row_start._4_4_] = puVar9[img_labels_row_start._4_4_ + -1];
            if (((int)img_row + -1 < 0) || (puVar8[img_labels_row_start._4_4_ - lVar3] == '\0')) {
              if (((int)img_row + -1 < 0) ||
                 ((iVar1 <= img_labels_row_start._4_4_ + 1 ||
                  (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')))) {
                c = 6;
              }
              else {
                RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                             *(uint *)((long)puVar9 +
                                      ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5)));
                c = 5;
              }
            }
            else {
              c = 4;
            }
          }
          else if (c == 5) {
            puVar9[img_labels_row_start._4_4_] = puVar9[img_labels_row_start._4_4_ + -1];
            r_i = 5;
          }
          else if (c == 6) {
            puVar9[img_labels_row_start._4_4_] = puVar9[img_labels_row_start._4_4_ + -1];
            if ((((int)img_row + -1 < 0) || (iVar1 <= img_labels_row_start._4_4_ + 1)) ||
               (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')) {
              c = 6;
            }
            else {
              RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                           *(uint *)((long)puVar9 +
                                    ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5)));
              c = 5;
            }
          }
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_];
          }
        }
        break;
      case 3:
        if (puVar8[img_labels_row_start._4_4_] == '\0') {
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(undefined4 *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 *(undefined4 *)((long)puVar9 + (long)(img_labels_row_start._4_4_ + -1) * 4 + lVar6)
            ;
            r_i = 9;
          }
          else {
            r_i = 1;
          }
        }
        else {
          r_i = 8;
          if (((int)img_row + -1 < 0) || (puVar8[img_labels_row_start._4_4_ - lVar3] == '\0')) {
            if (((int)img_row + -1 < 0) ||
               ((iVar1 <= img_labels_row_start._4_4_ + 1 ||
                (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')))) {
              puVar9[img_labels_row_start._4_4_] =
                   *(uint *)((long)puVar9 + (long)(img_labels_row_start._4_4_ + -1) * 4 + lVar6);
              if ((-1 < img_labels_row_start._4_4_ + -1) &&
                 ((-1 < (int)img_row + -1 &&
                  (puVar8[(img_labels_row_start._4_4_ + -1) - lVar3] != '\0')))) {
                RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                             *(uint *)((long)puVar9 +
                                      ((long)(img_labels_row_start._4_4_ + -1) * 4 - lVar5)));
              }
              c = 6;
            }
            else {
              puVar9[img_labels_row_start._4_4_] =
                   *(uint *)((long)puVar9 + ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5));
              RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                           *(uint *)((long)puVar9 +
                                    (long)(img_labels_row_start._4_4_ + -1) * 4 + lVar6));
              if (((-1 < img_labels_row_start._4_4_ + -1) && (-1 < (int)img_row + -1)) &&
                 (puVar8[(img_labels_row_start._4_4_ + -1) - lVar3] != '\0')) {
                RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                             *(uint *)((long)puVar9 +
                                      ((long)(img_labels_row_start._4_4_ + -1) * 4 - lVar5)));
              }
              c = 5;
            }
          }
          else {
            puVar9[img_labels_row_start._4_4_] =
                 *(uint *)((long)puVar9 + ((long)img_labels_row_start._4_4_ * 4 - lVar5));
            RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                         *(uint *)((long)puVar9 +
                                  (long)(img_labels_row_start._4_4_ + -1) * 4 + lVar6));
            c = 4;
          }
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_];
          }
        }
        break;
      case 4:
        if (puVar8[img_labels_row_start._4_4_] == '\0') {
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_ + -1];
            r_i = 7;
          }
          else {
            r_i = 1;
          }
        }
        else {
          if (c == 4) {
            r_i = 4;
            puVar9[img_labels_row_start._4_4_] = puVar9[img_labels_row_start._4_4_ + -1];
            if (((int)img_row + -1 < 0) || (puVar8[img_labels_row_start._4_4_ - lVar3] == '\0')) {
              if (((int)img_row + -1 < 0) ||
                 ((iVar1 <= img_labels_row_start._4_4_ + 1 ||
                  (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')))) {
                c = 6;
              }
              else {
                RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                             *(uint *)((long)puVar9 +
                                      ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5)));
                c = 5;
              }
            }
            else {
              c = 4;
            }
          }
          else if (c == 5) {
            puVar9[img_labels_row_start._4_4_] = puVar9[img_labels_row_start._4_4_ + -1];
            r_i = 5;
          }
          else if (c == 6) {
            puVar9[img_labels_row_start._4_4_] = puVar9[img_labels_row_start._4_4_ + -1];
            if ((((int)img_row + -1 < 0) || (iVar1 <= img_labels_row_start._4_4_ + 1)) ||
               (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')) {
              c = 6;
            }
            else {
              RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                           *(uint *)((long)puVar9 +
                                    ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5)));
              c = 5;
            }
          }
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_];
          }
        }
        break;
      case 5:
        if (puVar8[img_labels_row_start._4_4_] == '\0') {
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_ + -1];
            r_i = 7;
          }
          else {
            r_i = 1;
          }
        }
        else {
          r_i = 4;
          puVar9[img_labels_row_start._4_4_] = puVar9[img_labels_row_start._4_4_ + -1];
          if (((int)img_row + -1 < 0) || (puVar8[img_labels_row_start._4_4_ - lVar3] == '\0')) {
            if (((int)img_row + -1 < 0) ||
               ((iVar1 <= img_labels_row_start._4_4_ + 1 ||
                (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')))) {
              c = 6;
            }
            else {
              RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                           *(uint *)((long)puVar9 +
                                    ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5)));
              c = 5;
            }
          }
          else {
            c = 4;
          }
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_];
          }
        }
        break;
      case 6:
        if (puVar8[img_labels_row_start._4_4_] == '\0') {
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_ + -1];
            r_i = 7;
          }
          else {
            r_i = 1;
          }
        }
        else {
          if (c == 5) {
            puVar9[img_labels_row_start._4_4_] = puVar9[img_labels_row_start._4_4_ + -1];
            r_i = 5;
          }
          else if (c == 6) {
            puVar9[img_labels_row_start._4_4_] = puVar9[img_labels_row_start._4_4_ + -1];
            if ((((int)img_row + -1 < 0) || (iVar1 <= img_labels_row_start._4_4_ + 1)) ||
               (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')) {
              c = 6;
            }
            else {
              RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                           *(uint *)((long)puVar9 +
                                    ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5)));
              c = 5;
            }
          }
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_];
          }
        }
        break;
      case 7:
        if (puVar8[img_labels_row_start._4_4_] == '\0') {
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(undefined4 *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 *(undefined4 *)((long)puVar9 + (long)(img_labels_row_start._4_4_ + -1) * 4 + lVar6)
            ;
            r_i = 9;
          }
          else {
            r_i = 1;
          }
        }
        else {
          r_i = 8;
          if (((int)img_row + -1 < 0) || (puVar8[img_labels_row_start._4_4_ - lVar3] == '\0')) {
            if (((int)img_row + -1 < 0) ||
               ((iVar1 <= img_labels_row_start._4_4_ + 1 ||
                (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')))) {
              puVar9[img_labels_row_start._4_4_] =
                   *(uint *)((long)puVar9 + (long)(img_labels_row_start._4_4_ + -1) * 4 + lVar6);
              if ((-1 < img_labels_row_start._4_4_ + -1) &&
                 ((-1 < (int)img_row + -1 &&
                  (puVar8[(img_labels_row_start._4_4_ + -1) - lVar3] != '\0')))) {
                RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                             *(uint *)((long)puVar9 +
                                      ((long)(img_labels_row_start._4_4_ + -1) * 4 - lVar5)));
              }
              c = 6;
            }
            else {
              puVar9[img_labels_row_start._4_4_] =
                   *(uint *)((long)puVar9 + ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5));
              RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                           *(uint *)((long)puVar9 +
                                    (long)(img_labels_row_start._4_4_ + -1) * 4 + lVar6));
              if (((-1 < img_labels_row_start._4_4_ + -1) && (-1 < (int)img_row + -1)) &&
                 (puVar8[(img_labels_row_start._4_4_ + -1) - lVar3] != '\0')) {
                RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                             *(uint *)((long)puVar9 +
                                      ((long)(img_labels_row_start._4_4_ + -1) * 4 - lVar5)));
              }
              c = 5;
            }
          }
          else {
            puVar9[img_labels_row_start._4_4_] =
                 *(uint *)((long)puVar9 + ((long)img_labels_row_start._4_4_ * 4 - lVar5));
            RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                         *(uint *)((long)puVar9 +
                                  (long)(img_labels_row_start._4_4_ + -1) * 4 + lVar6));
            c = 4;
          }
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_];
          }
        }
        break;
      case 8:
        if (puVar8[img_labels_row_start._4_4_] == '\0') {
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_ + -1];
            r_i = 7;
          }
          else {
            r_i = 1;
          }
        }
        else {
          if (c == 4) {
            r_i = 4;
            puVar9[img_labels_row_start._4_4_] = puVar9[img_labels_row_start._4_4_ + -1];
            if (((int)img_row + -1 < 0) || (puVar8[img_labels_row_start._4_4_ - lVar3] == '\0')) {
              if (((int)img_row + -1 < 0) ||
                 ((iVar1 <= img_labels_row_start._4_4_ + 1 ||
                  (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')))) {
                c = 6;
              }
              else {
                RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                             *(uint *)((long)puVar9 +
                                      ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5)));
                c = 5;
              }
            }
            else {
              c = 4;
            }
          }
          else if (c == 5) {
            puVar9[img_labels_row_start._4_4_] = puVar9[img_labels_row_start._4_4_ + -1];
            r_i = 5;
          }
          else if (c == 6) {
            puVar9[img_labels_row_start._4_4_] = puVar9[img_labels_row_start._4_4_ + -1];
            if ((((int)img_row + -1 < 0) || (iVar1 <= img_labels_row_start._4_4_ + 1)) ||
               (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')) {
              c = 6;
            }
            else {
              RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                           *(uint *)((long)puVar9 +
                                    ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5)));
              c = 5;
            }
          }
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_];
          }
        }
        break;
      case 9:
        if (puVar8[img_labels_row_start._4_4_] == '\0') {
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(undefined4 *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 *(undefined4 *)((long)puVar9 + (long)(img_labels_row_start._4_4_ + -1) * 4 + lVar6)
            ;
            r_i = 9;
          }
          else {
            r_i = 1;
          }
        }
        else {
          r_i = 8;
          if (((int)img_row + -1 < 0) || (puVar8[img_labels_row_start._4_4_ - lVar3] == '\0')) {
            if (((int)img_row + -1 < 0) ||
               ((iVar1 <= img_labels_row_start._4_4_ + 1 ||
                (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')))) {
              puVar9[img_labels_row_start._4_4_] =
                   *(uint *)((long)puVar9 + (long)(img_labels_row_start._4_4_ + -1) * 4 + lVar6);
              if ((-1 < img_labels_row_start._4_4_ + -1) &&
                 ((-1 < (int)img_row + -1 &&
                  (puVar8[(img_labels_row_start._4_4_ + -1) - lVar3] != '\0')))) {
                RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                             *(uint *)((long)puVar9 +
                                      ((long)(img_labels_row_start._4_4_ + -1) * 4 - lVar5)));
              }
              c = 6;
            }
            else {
              puVar9[img_labels_row_start._4_4_] =
                   *(uint *)((long)puVar9 + ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5));
              RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                           *(uint *)((long)puVar9 +
                                    (long)(img_labels_row_start._4_4_ + -1) * 4 + lVar6));
              if (((-1 < img_labels_row_start._4_4_ + -1) && (-1 < (int)img_row + -1)) &&
                 (puVar8[(img_labels_row_start._4_4_ + -1) - lVar3] != '\0')) {
                RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                             *(uint *)((long)puVar9 +
                                      ((long)(img_labels_row_start._4_4_ + -1) * 4 - lVar5)));
              }
              c = 5;
            }
          }
          else {
            puVar9[img_labels_row_start._4_4_] =
                 *(uint *)((long)puVar9 + ((long)img_labels_row_start._4_4_ * 4 - lVar5));
            RemSP::Merge(puVar9[img_labels_row_start._4_4_],
                         *(uint *)((long)puVar9 +
                                  (long)(img_labels_row_start._4_4_ + -1) * 4 + lVar6));
            c = 4;
          }
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_];
          }
        }
        break;
      case -1:
        if (puVar8[img_labels_row_start._4_4_] == '\0') {
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            uVar7 = RemSP::NewLabel();
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) = uVar7;
            r_i = 7;
          }
          else {
            r_i = 1;
          }
        }
        else {
          r_i = 2;
          if (((int)img_row + -1 < 0) || (puVar8[img_labels_row_start._4_4_ - lVar3] == '\0')) {
            if (((int)img_row + -1 < 0) ||
               ((iVar1 <= img_labels_row_start._4_4_ + 1 ||
                (puVar8[(img_labels_row_start._4_4_ + 1) - lVar3] == '\0')))) {
              uVar7 = RemSP::NewLabel();
              puVar9[img_labels_row_start._4_4_] = uVar7;
              c = 6;
            }
            else {
              puVar9[img_labels_row_start._4_4_] =
                   *(uint *)((long)puVar9 + ((long)(img_labels_row_start._4_4_ + 1) * 4 - lVar5));
              c = 5;
            }
          }
          else {
            puVar9[img_labels_row_start._4_4_] =
                 *(uint *)((long)puVar9 + ((long)img_labels_row_start._4_4_ * 4 - lVar5));
            c = 4;
          }
          if (((int)img_row + 1 < iVar2) && (puVar8[img_labels_row_start._4_4_ + lVar4] != '\0')) {
            *(uint *)((long)puVar9 + (long)img_labels_row_start._4_4_ * 4 + lVar6) =
                 puVar9[img_labels_row_start._4_4_];
          }
        }
      }
    }
  }
  uVar7 = RemSP::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar7;
  for (img_labels_row_start._0_4_ = 0;
      (int)img_labels_row_start <
      *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x8;
      img_labels_row_start._0_4_ = (int)img_labels_row_start + 1) {
    puStack_f0 = cv::Mat::ptr<unsigned_int>
                           (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                             super_Mat,(int)img_labels_row_start);
    puVar9 = puStack_f0 +
             *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0xc;
    for (; puStack_f0 != puVar9; puStack_f0 = puStack_f0 + 1) {
      uVar7 = RemSP::GetLabel(*puStack_f0);
      *puStack_f0 = uVar7;
    }
  }
  RemSP::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Scan Mask
        // +--+--+--+
        // |n1|n2|n3|
        // +--+--+--+
        // |n4|a |
        // +--+--+
        // |n5|b |
        // +--+--+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);
            unsigned int* const img_labels_row_fol = (unsigned int *)(((char *)img_labels_row) + img_labels_.step.p[0]);

            int prob_fol_state = BR;
            int prev_state = BR;

            for (int c = 0; c < w; c += 1) {

                // A bunch of defines used to check if the pixels are foreground, and current state of graph
                // without going outside the image limits.

#define CONDITION_A img_row[c]>0
#define CONDITION_B r+1<h && img_row_fol[c]>0
#define CONDITION_N1 c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_N2 r-1>=0 && img_row_prev[c]>0
#define CONDITION_N3 r-1>=0 && c+1<w && img_row_prev[c+1]>0
#define CONDITION_N4 c-1>=0 && img_row[c-1]>0
#define CONDITION_N5 c-1>=0 && r+1<h && img_row_fol[c-1]>0

#define ACTION_1 // nothing
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // a <- n1
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // a <- n2
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // a <- n3
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // a <- n4
#define ACTION_7 img_labels_row[c] = img_labels_row_fol[c - 1]; // a <- n5
#define ACTION_8 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c - 1]); // a + n1
#define ACTION_9 LabelsSolver::Merge(img_labels_row[c], img_labels_row_prev[c + 1]); // a + n3
#define ACTION_10 LabelsSolver::Merge(img_labels_row[c], img_labels_row_fol[c - 1]); // a + n5
#define ACTION_11 img_labels_row_fol[c] = LabelsSolver::NewLabel(); // b new label
#define ACTION_12 img_labels_row_fol[c] = img_labels_row[c - 1]; // b <- n4
#define ACTION_13 img_labels_row_fol[c] = img_labels_row_fol[c - 1]; // b <- n5
#define ACTION_14 img_labels_row_fol[c] = img_labels_row[c]; // b <- a

#include "labeling_he_2014_graph.inc.h"
            }//End columns's for
        }//End rows's for

#undef ACTION_1 
#undef ACTION_2 
#undef ACTION_3 
#undef ACTION_4 
#undef ACTION_5 
#undef ACTION_6 
#undef ACTION_7 
#undef ACTION_8 
#undef ACTION_9 
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14

#undef CONDITION_A 
#undef CONDITION_B 
#undef CONDITION_N1
#undef CONDITION_N2
#undef CONDITION_N3
#undef CONDITION_N4
#undef CONDITION_N5

        n_labels_ = LabelsSolver::Flatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *img_labels_row_start = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *img_labels_row_end = img_labels_row_start + img_labels_.cols;
            unsigned int *img_labels_row = img_labels_row_start;
            for (int c_i = 0; img_labels_row != img_labels_row_end; ++img_labels_row, ++c_i) {
                *img_labels_row = LabelsSolver::GetLabel(*img_labels_row);
            }
        }

        LabelsSolver::Dealloc();
    }